

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

void BrotliEncoderSetCustomDictionary(BrotliEncoderState *s,size_t size,uint8_t *dict)

{
  uint8_t *__s2;
  ushort uVar1;
  uint16_t uVar2;
  H2 *__s;
  H54 *__s_00;
  H6 *__s_01;
  H4 *__s_02;
  H42 *__s_03;
  H5 *__s_04;
  H9 *__s_05;
  H3 *__s_06;
  H7 *__s_07;
  H8 *__s_08;
  H10 *self;
  uint32_t *puVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  char cVar8;
  uint8_t *puVar9;
  uint *puVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  uint8_t *input_buffer;
  size_t input_size;
  ulong uVar23;
  H41 *__s_09;
  bool bVar24;
  int in_stack_ffffffffffffff78;
  uint8_t *local_78;
  ulong local_68;
  ulong local_60;
  
  iVar5 = (s->params).lgwin;
  EnsureInitialized(s);
  if ((size != 0) && (1 < (uint)(s->params).quality)) {
    uVar13 = (1L << ((byte)iVar5 & 0x3f)) - 0x10;
    input_size = size;
    if (uVar13 < size) {
      input_size = uVar13;
    }
    lVar14 = 0;
    if (uVar13 <= size) {
      lVar14 = size - uVar13;
    }
    input_buffer = dict + lVar14;
    CopyInputToRingBuffer(s,input_size,input_buffer);
    s->last_flush_pos_ = input_size;
    s->last_processed_pos_ = input_size;
    if (uVar13 != 0) {
      s->prev_byte_ = input_buffer[input_size - 1];
    }
    if (1 < input_size) {
      s->prev_byte2_ = input_buffer[input_size - 2];
    }
    iVar5 = (s->params).quality;
    iVar4 = 10;
    if (((iVar5 < 10) &&
        (((iVar5 != 4 || (iVar4 = 0x36, (s->params).size_hint < 0x100000)) &&
         (iVar4 = iVar5, 4 < iVar5)))) && ((s->params).lgwin < 0x11)) {
      iVar4 = 0x28;
      if (6 < iVar5) {
        iVar4 = (iVar5 == 9) + 0x29;
      }
    }
    if (iVar4 < 0x28) {
      switch(iVar4) {
      case 2:
        __s = (s->hashers_).h2;
        if (__s->is_dirty_ != 0) {
          memset(__s,0,0x40008);
        }
        if (7 < input_size) {
          lVar14 = 0;
          do {
            __s->buckets_[(ulong)(*(long *)(input_buffer + lVar14) * -0x42e1ca5843000000) >> 0x30] =
                 (uint32_t)lVar14;
            lVar14 = lVar14 + 1;
          } while (input_size - 7 != lVar14);
        }
        break;
      case 3:
        __s_06 = (s->hashers_).h3;
        if (__s_06->is_dirty_ != 0) {
          memset(__s_06,0,0x4000c);
        }
        if (7 < input_size) {
          lVar14 = 0;
          do {
            *(uint *)((long)__s_06->buckets_ +
                     (ulong)(((uint)(ushort)((ulong)(*(long *)(input_buffer + lVar14) *
                                                    -0x42e1ca5843000000) >> 0x30) +
                             (uint)(((uint)lVar14 >> 3 & 1) != 0)) * 4)) = (uint)lVar14;
            lVar14 = lVar14 + 1;
          } while (input_size - 7 != lVar14);
        }
        break;
      case 4:
        __s_02 = (s->hashers_).h4;
        if (__s_02->is_dirty_ != 0) {
          memset(__s_02,0,0x80014);
        }
        if (7 < input_size) {
          uVar13 = 0;
          do {
            __s_02->buckets_
            [(uint)((ulong)(*(long *)(input_buffer + uVar13) * -0x42e1ca5843000000) >> 0x2f) +
             ((uint)(uVar13 >> 3) & 3)] = (uint32_t)uVar13;
            uVar13 = uVar13 + 1;
          } while (input_size - 7 != uVar13);
        }
        break;
      case 5:
        __s_04 = (s->hashers_).h5;
        if (__s_04->is_dirty_ != 0) {
          memset(__s_04,0,0x8000);
          __s_04->is_dirty_ = 0;
        }
        if (3 < input_size) {
          lVar14 = 0;
          do {
            uVar11 = (uint)(*(int *)(input_buffer + lVar14) * 0x1e35a7bd) >> 0x12;
            uVar1 = __s_04->num_[uVar11];
            *(int *)((long)__s_04->buckets_ + (ulong)(uVar11 * 0x40 + (uVar1 & 0xf) * 4)) =
                 (int)lVar14;
            __s_04->num_[uVar11] = uVar1 + 1;
            lVar14 = lVar14 + 1;
          } while (input_size - 3 != lVar14);
        }
        break;
      case 6:
        __s_01 = (s->hashers_).h6;
        if (__s_01->is_dirty_ != 0) {
          memset(__s_01,0,0x8000);
          __s_01->is_dirty_ = 0;
        }
        if (3 < input_size) {
          lVar14 = 0;
          do {
            uVar11 = (uint)(*(int *)(input_buffer + lVar14) * 0x1e35a7bd) >> 0x12;
            uVar1 = __s_01->num_[uVar11];
            *(int *)((long)__s_01->buckets_ + (ulong)(uVar11 * 0x80 + (uVar1 & 0x1f) * 4)) =
                 (int)lVar14;
            __s_01->num_[uVar11] = uVar1 + 1;
            lVar14 = lVar14 + 1;
          } while (input_size - 3 != lVar14);
        }
        break;
      case 7:
        __s_07 = (s->hashers_).h7;
        if (__s_07->is_dirty_ != 0) {
          memset(__s_07,0,0x10000);
          __s_07->is_dirty_ = 0;
        }
        if (3 < input_size) {
          lVar14 = 0;
          do {
            uVar11 = (uint)(*(int *)(input_buffer + lVar14) * 0x1e35a7bd) >> 0x11;
            uVar1 = __s_07->num_[uVar11];
            *(int *)((long)__s_07->buckets_ + (ulong)(uVar11 * 0x100 + (uVar1 & 0x3f) * 4)) =
                 (int)lVar14;
            __s_07->num_[uVar11] = uVar1 + 1;
            lVar14 = lVar14 + 1;
          } while (input_size - 3 != lVar14);
        }
        break;
      case 8:
        __s_08 = (s->hashers_).h8;
        if (__s_08->is_dirty_ != 0) {
          memset(__s_08,0,0x10000);
          __s_08->is_dirty_ = 0;
        }
        if (3 < input_size) {
          lVar14 = 0;
          do {
            uVar11 = (uint)(*(int *)(input_buffer + lVar14) * 0x1e35a7bd) >> 0x11;
            uVar1 = __s_08->num_[uVar11];
            *(int *)((long)__s_08->buckets_ + (ulong)(uVar11 * 0x200 + (uVar1 & 0x7f) * 4)) =
                 (int)lVar14;
            __s_08->num_[uVar11] = uVar1 + 1;
            lVar14 = lVar14 + 1;
          } while (input_size - 3 != lVar14);
        }
        break;
      case 9:
        __s_05 = (s->hashers_).h9;
        if (__s_05->is_dirty_ != 0) {
          memset(__s_05,0,0x10000);
          __s_05->is_dirty_ = 0;
        }
        if (3 < input_size) {
          lVar14 = 0;
          do {
            uVar11 = (uint)(*(int *)(input_buffer + lVar14) * 0x1e35a7bd) >> 0x11;
            uVar2 = __s_05->num_[uVar11];
            *(int *)((long)__s_05->buckets_ + (ulong)(uVar11 * 0x400 + (uint)(byte)uVar2 * 4)) =
                 (int)lVar14;
            __s_05->num_[uVar11] = uVar2 + 1;
            lVar14 = lVar14 + 1;
          } while (input_size - 3 != lVar14);
        }
        break;
      case 10:
        self = (s->hashers_).h10;
        InitH10(&s->memory_manager_,self,(uint8_t *)s,(BrotliEncoderParams *)0x0,input_size,0,
                in_stack_ffffffffffffff78);
        if (0x7f < input_size) {
          uVar13 = self->window_mask_;
          uVar16 = 0;
          local_78 = input_buffer;
LAB_0012b88a:
          uVar11 = (uint)(*(int *)(input_buffer + uVar16) * 0x1e35a7bd) >> 0xf;
          uVar23 = (ulong)self->buckets_[uVar11];
          uVar22 = (uVar13 & uVar16) * 2 + 1;
          uVar7 = (uVar13 & uVar16) * 2;
          self->buckets_[uVar11] = (uint32_t)uVar16;
          lVar14 = 0x40;
          local_60 = 0;
          local_68 = 0;
LAB_0012b8d8:
          if ((uVar16 != uVar23) && (lVar14 != 0 && uVar16 - uVar23 <= uVar13 - 0xf)) {
            uVar6 = local_68;
            if (local_60 < local_68) {
              uVar6 = local_60;
            }
            if (0x80 < uVar6) {
              __assert_fail("cur_len <= MAX_TREE_COMP_LENGTH",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                            ,0x9d,
                            "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                           );
            }
            __s2 = input_buffer + uVar23;
            puVar9 = __s2 + uVar6;
            uVar12 = 0x80 - uVar6;
            if (uVar6 < 0x79) {
              uVar21 = uVar12 >> 3;
              uVar15 = (ulong)((uint)uVar12 & 0xf8);
              lVar17 = 0;
LAB_0012b973:
              if (*(ulong *)(puVar9 + lVar17) == *(ulong *)(local_78 + lVar17 + uVar6))
              goto code_r0x0012b980;
              uVar15 = *(ulong *)(local_78 + lVar17 + uVar6) ^ *(ulong *)(puVar9 + lVar17);
              uVar12 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                }
              }
              uVar21 = (uVar12 >> 3 & 0x1fffffff) + lVar17;
              goto LAB_0012b9a4;
            }
            uVar15 = 0;
            goto LAB_0012ba6d;
          }
          puVar3 = self->forest_;
          puVar3[uVar7] = self->invalid_pos_;
          puVar3[uVar22] = self->invalid_pos_;
          bVar24 = false;
          goto LAB_0012b912;
        }
      }
    }
    else {
      cVar8 = (char)iVar5;
      if (iVar4 < 0x2a) {
        if (iVar4 == 0x28) {
          __s_09 = (H41 *)(s->hashers_).h40;
          __s_09->max_hops = (ulong)((iVar5 < 7) + 7 << (cVar8 - 4U & 0x1f));
          if (__s_09->is_dirty_ != 0) {
            memset(__s_09,0xcc,0x20000);
            __s_09->free_slot_idx[0] = 0;
            __s_09->is_dirty_ = 0;
            memset(__s_09->head,0,0x20000);
          }
          if (input_size < 4) {
            return;
          }
          uVar1 = __s_09->free_slot_idx[0];
          uVar13 = 0;
          do {
            uVar11 = (uint)(*(int *)(input_buffer + uVar13) * 0x1e35a7bd) >> 0x11;
            uVar16 = uVar13 - __s_09->addr[uVar11];
            __s_09->tiny_hash[uVar13 & 0xffff] = (uint8_t)uVar11;
            if (0xfffe < uVar16) {
              uVar16 = 0xffff;
            }
            uVar19 = (uint)uVar1 + (uint32_t)uVar13;
            uVar20 = uVar19 & 0xffff;
            __s_09->banks[0].slots[uVar20].delta = (uint16_t)uVar16;
            __s_09->banks[0].slots[uVar20].next = __s_09->head[uVar11];
            __s_09->addr[uVar11] = (uint32_t)uVar13;
            __s_09->head[uVar11] = (uint16_t)uVar19;
            uVar13 = uVar13 + 1;
          } while (input_size - 3 != uVar13);
        }
        else {
          if (iVar4 != 0x29) {
            return;
          }
          __s_09 = (s->hashers_).h41;
          __s_09->max_hops = (ulong)((iVar5 < 7) + 7 << (cVar8 - 4U & 0x1f));
          if (__s_09->is_dirty_ != 0) {
            memset(__s_09,0xcc,0x20000);
            __s_09->free_slot_idx[0] = 0;
            __s_09->is_dirty_ = 0;
            memset(__s_09->head,0,0x20000);
          }
          if (input_size < 4) {
            return;
          }
          uVar1 = __s_09->free_slot_idx[0];
          uVar13 = 0;
          do {
            uVar11 = (uint)(*(int *)(input_buffer + uVar13) * 0x1e35a7bd) >> 0x11;
            uVar16 = uVar13 - __s_09->addr[uVar11];
            __s_09->tiny_hash[uVar13 & 0xffff] = (uint8_t)uVar11;
            if (0xfffe < uVar16) {
              uVar16 = 0xffff;
            }
            uVar19 = (uint)uVar1 + (uint32_t)uVar13;
            uVar20 = uVar19 & 0xffff;
            __s_09->banks[0].slots[uVar20].delta = (uint16_t)uVar16;
            __s_09->banks[0].slots[uVar20].next = __s_09->head[uVar11];
            __s_09->addr[uVar11] = (uint32_t)uVar13;
            __s_09->head[uVar11] = (uint16_t)uVar19;
            uVar13 = uVar13 + 1;
          } while (input_size - 3 != uVar13);
        }
        __s_09->free_slot_idx[0] = uVar1 + (short)uVar13;
      }
      else if (iVar4 == 0x2a) {
        __s_03 = (s->hashers_).h42;
        __s_03->max_hops = (ulong)((iVar5 < 7) + 7 << (cVar8 - 4U & 0x1f));
        if (__s_03->is_dirty_ != 0) {
          memset(__s_03,0xcc,0x20000);
          memset(__s_03->head,0,0x20000);
          memset(__s_03->free_slot_idx,0,0x404);
        }
        if (3 < input_size) {
          uVar13 = 0;
          do {
            uVar11 = (uint)(*(int *)(input_buffer + uVar13) * 0x1e35a7bd) >> 0x11;
            uVar20 = uVar11 & 0x1ff;
            uVar1 = __s_03->free_slot_idx[uVar20];
            __s_03->free_slot_idx[uVar20] = uVar1 + 1;
            uVar19 = uVar1 & 0x1ff;
            uVar16 = uVar13 - __s_03->addr[uVar11];
            __s_03->tiny_hash[uVar13 & 0xffff] = (uint8_t)uVar11;
            if (0xfffe < uVar16) {
              uVar16 = 0xffff;
            }
            *(short *)((long)&__s_03->banks[0].slots[uVar19].delta + (ulong)(uVar20 << 0xb)) =
                 (short)uVar16;
            *(uint16_t *)((long)&__s_03->banks[0].slots[uVar19].next + (ulong)(uVar20 << 0xb)) =
                 __s_03->head[uVar11];
            __s_03->addr[uVar11] = (uint32_t)uVar13;
            __s_03->head[uVar11] = (uint16_t)uVar19;
            uVar13 = uVar13 + 1;
          } while (input_size - 3 != uVar13);
        }
      }
      else if (iVar4 == 0x36) {
        __s_00 = (s->hashers_).h54;
        if (__s_00->is_dirty_ != 0) {
          memset(__s_00,0,0x400014);
        }
        if (7 < input_size) {
          uVar13 = 0;
          do {
            __s_00->buckets_
            [(uint)((ulong)(*(long *)(input_buffer + uVar13) * 0x35a7bd1e35a7bd00) >> 0x2c) +
             ((uint)(uVar13 >> 3) & 3)] = (uint32_t)uVar13;
            uVar13 = uVar13 + 1;
          } while (input_size - 7 != uVar13);
        }
      }
    }
  }
  return;
code_r0x0012b980:
  lVar17 = lVar17 + 8;
  uVar21 = uVar21 - 1;
  if (uVar21 == 0) goto code_r0x0012b989;
  goto LAB_0012b973;
code_r0x0012b989:
  puVar9 = puVar9 + lVar17;
LAB_0012ba6d:
  uVar12 = uVar12 & 7;
  uVar21 = uVar15;
  if (uVar12 != 0) {
    uVar18 = uVar15 | uVar12;
    do {
      uVar21 = uVar15;
      if (local_78[uVar15 + uVar6] != *puVar9) break;
      puVar9 = puVar9 + 1;
      uVar15 = uVar15 + 1;
      uVar12 = uVar12 - 1;
      uVar21 = uVar18;
    } while (uVar12 != 0);
  }
LAB_0012b9a4:
  uVar21 = uVar21 + uVar6;
  iVar5 = bcmp(input_buffer + uVar16,__s2,uVar21);
  if (iVar5 != 0) {
    __assert_fail("0 == memcmp(&data[cur_ix_masked], &data[prev_ix_masked], len)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                  ,0xa2,
                  "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                 );
  }
  if (uVar21 < 0x80) {
    uVar12 = uVar23 & uVar13;
    uVar6 = uVar12 * 2;
    if (__s2[uVar21] < (input_buffer + uVar16)[uVar21]) {
      puVar3 = self->forest_;
      puVar3[uVar7] = (uint32_t)uVar23;
      puVar10 = puVar3 + uVar12 * 2 + 1;
      uVar7 = uVar6 | 1;
      uVar6 = uVar22;
      local_60 = uVar21;
    }
    else {
      puVar3 = self->forest_;
      puVar3[uVar22] = (uint32_t)uVar23;
      puVar10 = puVar3 + uVar12 * 2;
      local_68 = uVar21;
    }
    uVar23 = (ulong)*puVar10;
    bVar24 = true;
    uVar22 = uVar6;
  }
  else {
    puVar3 = self->forest_;
    puVar3[uVar7] = puVar3[(uVar23 & uVar13) * 2];
    puVar3[uVar22] = puVar3[(uVar23 & uVar13) * 2 + 1];
    bVar24 = false;
  }
LAB_0012b912:
  lVar14 = lVar14 + -1;
  if (!bVar24) goto LAB_0012baae;
  goto LAB_0012b8d8;
LAB_0012baae:
  local_78 = local_78 + 1;
  bVar24 = uVar16 == input_size - 0x80;
  uVar16 = uVar16 + 1;
  if (bVar24) {
    return;
  }
  goto LAB_0012b88a;
}

Assistant:

void BrotliEncoderSetCustomDictionary(BrotliEncoderState* s, size_t size,
                                      const uint8_t* dict) {
  size_t max_dict_size = BROTLI_MAX_BACKWARD_LIMIT(s->params.lgwin);
  size_t dict_size = size;
  MemoryManager* m = &s->memory_manager_;

  if (!EnsureInitialized(s)) return;

  if (dict_size == 0 ||
      s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    return;
  }
  if (size > max_dict_size) {
    dict += size - max_dict_size;
    dict_size = max_dict_size;
  }
  CopyInputToRingBuffer(s, dict_size, dict);
  s->last_flush_pos_ = dict_size;
  s->last_processed_pos_ = dict_size;
  if (dict_size > 0) {
    s->prev_byte_ = dict[dict_size - 1];
  }
  if (dict_size > 1) {
    s->prev_byte2_ = dict[dict_size - 2];
  }
  HashersPrependCustomDictionary(m, &s->hashers_, &s->params, dict_size, dict);
  if (BROTLI_IS_OOM(m)) return;
}